

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * Catch::fpToString<float>(string *__return_storage_ptr__,float value,int precision)

{
  long lVar1;
  string local_1b0 [32];
  ostringstream oss;
  long local_188 [2];
  uint auStack_178 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  *(long *)((long)local_188 + *(long *)(_oss + -0x18)) = (long)precision;
  *(uint *)((long)auStack_178 + *(long *)(_oss + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(_oss + -0x18)) & 0xfffffefb | 4;
  std::ostream::operator<<((ostringstream *)&oss,value);
  std::__cxx11::stringbuf::str();
  lVar1 = std::__cxx11::string::find_last_not_of((char)__return_storage_ptr__,0x30);
  if ((lVar1 != -1) && (lVar1 != __return_storage_ptr__->_M_string_length - 1)) {
    std::__cxx11::string::substr((ulong)local_1b0,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_1b0);
    std::__cxx11::string::~string(local_1b0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

std::string fpToString( T value, int precision ) {
    std::ostringstream oss;
    oss << std::setprecision( precision )
        << std::fixed
        << value;
    std::string d = oss.str();
    std::size_t i = d.find_last_not_of( '0' );
    if( i != std::string::npos && i != d.size()-1 ) {
        if( d[i] == '.' )
            i++;
        d = d.substr( 0, i+1 );
    }
    return d;
}